

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall maths::Matrix::gaussianEliminate(Matrix *this)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  double **extraout_RDX;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Matrix *in_RSI;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  Matrix MVar18;
  double **ppdVar6;
  
  Matrix(this,in_RSI);
  uVar4 = (ulong)this->rows_;
  ppdVar6 = extraout_RDX;
  if (0 < (long)uVar4) {
    iVar1 = this->cols_;
    uVar5 = iVar1 - 1;
    ppdVar6 = (double **)(ulong)uVar5;
    ppdVar2 = this->p;
    uVar12 = 0;
    uVar10 = 1;
    iVar11 = 0;
    do {
      if (iVar11 < (int)uVar5) {
        lVar7 = (long)iVar11;
        do {
          dVar16 = ppdVar2[uVar12][iVar11];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
LAB_0011c88d:
            if ((long)(uVar12 + 1) < (long)uVar4) {
              uVar13 = uVar10;
              do {
                lVar14 = lVar7;
                if (iVar11 + 1 < iVar1) {
                  do {
                    pdVar3 = ppdVar2[uVar13];
                    dVar16 = pdVar3[lVar14 + 1] -
                             (pdVar3[iVar11] / ppdVar2[uVar12][iVar11]) *
                             ppdVar2[uVar12][lVar14 + 1];
                    pdVar3[lVar14 + 1] = (double)(~-(ulong)(ABS(dVar16) < 1e-10) & (ulong)dVar16);
                    lVar14 = lVar14 + 1;
                  } while (uVar5 != (uint)lVar14);
                }
                ppdVar2[uVar13][iVar11] = 0.0;
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar4);
            }
            break;
          }
          uVar8 = (uint)uVar12;
          if ((long)uVar12 < (long)(uVar4 - 1)) {
            dVar16 = 0.0;
            uVar9 = uVar12 & 0xffffffff;
            uVar13 = uVar10;
            do {
              dVar17 = ppdVar2[uVar13][iVar11];
              uVar15 = -(ulong)(dVar17 < -dVar17);
              dVar17 = (double)(~uVar15 & (ulong)dVar17 | (ulong)-dVar17 & uVar15);
              if (dVar16 < dVar17) {
                uVar9 = uVar13 & 0xffffffff;
              }
              uVar8 = (uint)uVar9;
              if (dVar17 <= dVar16) {
                dVar17 = dVar16;
              }
              dVar16 = dVar17;
              uVar13 = uVar13 + 1;
            } while (uVar4 != uVar13);
          }
          if (uVar12 != uVar8) {
            pdVar3 = ppdVar2[(int)uVar8];
            ppdVar2[(int)uVar8] = ppdVar2[uVar12];
            ppdVar2[uVar12] = pdVar3;
            goto LAB_0011c88d;
          }
          iVar11 = iVar11 + 1;
          lVar7 = lVar7 + 1;
        } while (iVar11 < (int)uVar5);
      }
      uVar12 = uVar12 + 1;
      iVar11 = iVar11 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar4);
  }
  MVar18.p = ppdVar6;
  MVar18._0_8_ = this;
  return MVar18;
}

Assistant:

Matrix Matrix::gaussianEliminate()
{
    Matrix Ab(*this);
    int rows = Ab.rows_;
    int cols = Ab.cols_;
    int Acols = cols - 1;

    int i = 0; // row tracker
    int j = 0; // column tracker

    // iterate through the rows
    while (i < rows)
    {
        // find a pivot for the row
        bool pivot_found = false;
        while (j < Acols && !pivot_found)
        {
            if (Ab(i, j) != 0) { // pivot not equal to 0
                pivot_found = true;
            } else { // check for a possible swap
                int max_row = i;
                double max_val = 0;
                for (int k = i + 1; k < rows; ++k)
                {
                    double cur_abs = Ab(k, j) >= 0 ? Ab(k, j) : -1 * Ab(k, j);
                    if (cur_abs > max_val)
                    {
                        max_row = k;
                        max_val = cur_abs;
                    }
                }
                if (max_row != i) {
                    Ab.swapRows(max_row, i);
                    pivot_found = true;
                } else {
                    j++;
                }
            }
        }

        // perform elimination as normal if pivot was found
        if (pivot_found)
        {
            for (int t = i + 1; t < rows; ++t) {
                for (int s = j + 1; s < cols; ++s) {
                    Ab(t, s) = Ab(t, s) - Ab(i, s) * (Ab(t, j) / Ab(i, j));
                    if (Ab(t, s) < EPS && Ab(t, s) > -1*EPS)
                        Ab(t, s) = 0;
                }
                Ab(t, j) = 0;
            }
        }

        i++;
        j++;
    }

    return Ab;
}